

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_clone_alloc(wally_psbt *psbt,uint32_t flags,wally_psbt **output)

{
  size_t global_unknowns_allocation_len;
  wally_psbt *psbt_00;
  int iVar1;
  size_t is_elements;
  
  if (output != (wally_psbt **)0x0) {
    *output = (wally_psbt *)0x0;
  }
  if ((psbt == (wally_psbt *)0x0 || output == (wally_psbt **)0x0) || flags != 0) {
    iVar1 = -2;
  }
  else {
    iVar1 = wally_psbt_is_elements(psbt,&is_elements);
    if (iVar1 == 0) {
      global_unknowns_allocation_len = (psbt->unknowns).items_allocation_len;
      if (is_elements == 0) {
        iVar1 = wally_psbt_init_alloc
                          (psbt->version,psbt->inputs_allocation_len,psbt->outputs_allocation_len,
                           global_unknowns_allocation_len,output);
      }
      else {
        iVar1 = wally_psbt_elements_init_alloc
                          (psbt->version,psbt->inputs_allocation_len,psbt->outputs_allocation_len,
                           global_unknowns_allocation_len,output);
      }
      if (iVar1 == 0) {
        psbt_00 = *output;
        psbt_00->num_inputs = psbt->num_inputs;
        psbt_00->num_outputs = psbt->num_outputs;
        iVar1 = psbt_combine(psbt_00,psbt);
        if (iVar1 == 0) {
          if (psbt->tx == (wally_tx *)0x0) {
            return 0;
          }
          iVar1 = tx_clone_alloc(psbt->tx,&(*output)->tx);
          if (iVar1 == 0) {
            return 0;
          }
        }
        wally_psbt_free(*output);
        *output = (wally_psbt *)0x0;
      }
    }
  }
  return iVar1;
}

Assistant:

int wally_psbt_clone_alloc(const struct wally_psbt *psbt, uint32_t flags,
                           struct wally_psbt **output)
{
#ifdef BUILD_ELEMENTS
    size_t is_elements;
#endif /* BUILD_ELEMENTS */
    int ret;

    if (output)
        *output = NULL;
    if (!psbt || flags || !output)
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if ((ret = wally_psbt_is_elements(psbt, &is_elements)) != WALLY_OK)
        return ret;

    if (is_elements)
        ret = wally_psbt_elements_init_alloc(psbt->version,
                                             psbt->inputs_allocation_len,
                                             psbt->outputs_allocation_len,
                                             psbt->unknowns.items_allocation_len,
                                             output);
    else
#endif /* BUILD_ELEMENTS */
    ret = wally_psbt_init_alloc(psbt->version,
                                psbt->inputs_allocation_len,
                                psbt->outputs_allocation_len,
                                psbt->unknowns.items_allocation_len,
                                output);
    if (ret == WALLY_OK) {
        (*output)->num_inputs = psbt->num_inputs;
        (*output)->num_outputs = psbt->num_outputs;
        ret = psbt_combine(*output, psbt);

        if (ret == WALLY_OK && psbt->tx)
            ret = tx_clone_alloc(psbt->tx, &(*output)->tx);
        if (ret != WALLY_OK) {
            wally_psbt_free(*output);
            *output = NULL;
        }
    }
    return ret;
}